

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::WriteRingBuffer
          (BrotliDecoderStateInternal *s,size_t *available_out,uint8_t **next_out,size_t *total_out,
          int force)

{
  int iVar1;
  uint8_t *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t *in_RCX;
  long *in_RDX;
  ulong *in_RSI;
  BrotliDecoderStateInternal *in_RDI;
  int in_R8D;
  size_t num_written;
  size_t to_write;
  uint8_t *start;
  size_t local_48;
  BrotliDecoderErrorCode local_4;
  
  puVar2 = in_RDI->ringbuffer;
  uVar3 = in_RDI->partial_pos_out;
  iVar1 = in_RDI->ringbuffer_mask;
  sVar4 = UnwrittenBytes(in_RDI,1);
  local_48 = *in_RSI;
  if (sVar4 < *in_RSI) {
    local_48 = sVar4;
  }
  if (in_RDI->meta_block_remaining_len < 0) {
    local_4 = BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1;
  }
  else {
    if ((in_RDX == (long *)0x0) || (*in_RDX != 0)) {
      if (in_RDX != (long *)0x0) {
        memcpy((void *)*in_RDX,puVar2 + (uVar3 & (long)iVar1),local_48);
        *in_RDX = local_48 + *in_RDX;
      }
    }
    else {
      *in_RDX = (long)(puVar2 + (uVar3 & (long)iVar1));
    }
    *in_RSI = *in_RSI - local_48;
    in_RDI->partial_pos_out = local_48 + in_RDI->partial_pos_out;
    if (in_RCX != (size_t *)0x0) {
      *in_RCX = in_RDI->partial_pos_out;
    }
    if (local_48 < sVar4) {
      if ((in_RDI->ringbuffer_size == 1 << ((byte)(*(uint *)&in_RDI->field_0x304 >> 6) & 0x1f)) ||
         (in_R8D != 0)) {
        local_4 = BROTLI_DECODER_NEEDS_MORE_OUTPUT;
      }
      else {
        local_4 = BROTLI_DECODER_SUCCESS;
      }
    }
    else {
      if ((in_RDI->ringbuffer_size == 1 << ((byte)(*(uint *)&in_RDI->field_0x304 >> 6) & 0x1f)) &&
         (in_RDI->ringbuffer_size <= in_RDI->pos)) {
        in_RDI->pos = in_RDI->pos - in_RDI->ringbuffer_size;
        in_RDI->rb_roundtrips = in_RDI->rb_roundtrips + 1;
        *(uint *)&in_RDI->field_0x304 =
             *(uint *)&in_RDI->field_0x304 & 0xfffffff7 | (uint)(in_RDI->pos != 0) << 3;
      }
      local_4 = BROTLI_DECODER_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE WriteRingBuffer(BrotliDecoderState *s, size_t *available_out,
                                                              uint8_t **next_out, size_t *total_out,
                                                              BROTLI_BOOL force) {
	uint8_t *start = s->ringbuffer + (s->partial_pos_out & (size_t)s->ringbuffer_mask);
	size_t to_write = UnwrittenBytes(s, BROTLI_TRUE);
	size_t num_written = *available_out;
	if (num_written > to_write) {
		num_written = to_write;
	}
	if (s->meta_block_remaining_len < 0) {
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1);
	}
	if (next_out && !*next_out) {
		*next_out = start;
	} else {
		if (next_out) {
			memcpy(*next_out, start, num_written);
			*next_out += num_written;
		}
	}
	*available_out -= num_written;
	BROTLI_LOG_UINT(to_write);
	BROTLI_LOG_UINT(num_written);
	s->partial_pos_out += num_written;
	if (total_out) {
		*total_out = s->partial_pos_out;
	}
	if (num_written < to_write) {
		if (s->ringbuffer_size == (1 << s->window_bits) || force) {
			return BROTLI_DECODER_NEEDS_MORE_OUTPUT;
		} else {
			return BROTLI_DECODER_SUCCESS;
		}
	}
	/* Wrap ring buffer only if it has reached its maximal size. */
	if (s->ringbuffer_size == (1 << s->window_bits) && s->pos >= s->ringbuffer_size) {
		s->pos -= s->ringbuffer_size;
		s->rb_roundtrips++;
		s->should_wrap_ringbuffer = (size_t)s->pos != 0 ? 1 : 0;
	}
	return BROTLI_DECODER_SUCCESS;
}